

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::World(World *this)

{
  File_logger *this_00;
  Datetime_formatter *this_01;
  allocator local_79;
  string local_78 [32];
  shared_ptr<util::logging::Formatter> local_58;
  allocator local_41;
  string local_40 [48];
  World *local_10;
  World *this_local;
  
  this->_vptr_World = (_func_int **)&PTR__World_00147428;
  local_10 = this;
  std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>::
  vector(&this->pops);
  std::
  vector<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ::vector(&this->oldpops);
  this_00 = (File_logger *)operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"genfunop.log",&local_41);
  this_01 = (Datetime_formatter *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"%Y-%m-%dT%H:%M:%S%z",&local_79);
  util::logging::Datetime_formatter::Datetime_formatter(this_01,(string *)local_78);
  boost::shared_ptr<util::logging::Formatter>::shared_ptr<util::logging::Datetime_formatter>
            (&local_58,this_01);
  util::logging::File_logger::File_logger(this_00,(string *)local_40,&local_58,0x7f);
  boost::shared_ptr<util::logging::File_logger>::shared_ptr<util::logging::File_logger>
            (&this->LOGFILE,this_00);
  boost::shared_ptr<util::logging::Formatter>::~shared_ptr(&local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

World::World() :
	LOGFILE(new util::logging::File_logger())
{
}